

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Primer::Dump(Primer *this,FILE *stream)

{
  Dictionary *this_00;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference pLVar4;
  byte_t *ul_buf;
  MDDEntry *pMVar5;
  char *pcVar6;
  char *local_f0;
  MDDEntry *Entry;
  _Self local_a0;
  iterator i;
  char identbuf [128];
  FILE *stream_local;
  Primer *this_local;
  
  if (this->m_Dict != (Dictionary *)0x0) {
    identbuf._120_8_ = stream;
    if (stream == (FILE *)0x0) {
      identbuf._120_8_ = _stderr;
    }
    KLVPacket::Dump((KLVPacket *)this,(FILE *)identbuf._120_8_,this->m_Dict,false);
    sVar2 = std::
            set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
            ::size(&(this->LocalTagEntryBatch).
                    super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                    .super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>.
                    super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
                  );
    sVar3 = std::
            set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
            ::size(&(this->LocalTagEntryBatch).
                    super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                    .super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>.
                    super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
                  );
    pcVar6 = "entries";
    if (sVar3 == 1) {
      pcVar6 = "entry";
    }
    fprintf((FILE *)identbuf._120_8_,"Primer: %u %s\n",sVar2 & 0xffffffff,pcVar6);
    local_a0._M_node =
         (_Base_ptr)
         std::
         set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
         ::begin(&(this->LocalTagEntryBatch).
                  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                  .super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>.
                  super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
                );
    while( true ) {
      Entry = (MDDEntry *)
              std::
              set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
              ::end(&(this->LocalTagEntryBatch).
                     super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::MXF::Primer::LocalTagEntry>_>
                     .super_PushSet<ASDCP::MXF::Primer::LocalTagEntry>.
                     super_set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
                   );
      bVar1 = std::operator!=(&local_a0,(_Self *)&Entry);
      if (!bVar1) break;
      this_00 = this->m_Dict;
      pLVar4 = std::_Rb_tree_const_iterator<ASDCP::MXF::Primer::LocalTagEntry>::operator*(&local_a0)
      ;
      ul_buf = Kumu::Identifier<16U>::Value(&(pLVar4->UL).super_Identifier<16U>);
      pMVar5 = Dictionary::FindULAnyVersion(this_00,ul_buf);
      pLVar4 = std::_Rb_tree_const_iterator<ASDCP::MXF::Primer::LocalTagEntry>::operator*(&local_a0)
      ;
      pcVar6 = LocalTagEntry::EncodeString(pLVar4,(char *)&i,0x80);
      if (pMVar5 == (MDDEntry *)0x0) {
        local_f0 = "Unknown";
      }
      else {
        local_f0 = pMVar5->name;
      }
      fprintf((FILE *)identbuf._120_8_,"  %s %s\n",pcVar6,local_f0);
      std::_Rb_tree_const_iterator<ASDCP::MXF::Primer::LocalTagEntry>::operator++(&local_a0,0);
    }
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x24f,"virtual void ASDCP::MXF::Primer::Dump(FILE *)");
}

Assistant:

void
ASDCP::MXF::Primer::Dump(FILE* stream)
{
  assert(m_Dict);
  char identbuf[IdentBufferLen];

  if ( stream == 0 )
    stream = stderr;

  KLVPacket::Dump(stream, *m_Dict, false);
  fprintf(stream, "Primer: %u %s\n",
	  (ui32_t)LocalTagEntryBatch.size(),
	  ( LocalTagEntryBatch.size() == 1 ? "entry" : "entries" ));
  
  Batch<LocalTagEntry>::iterator i = LocalTagEntryBatch.begin();
  for ( ; i != LocalTagEntryBatch.end(); i++ )
    {
      const MDDEntry* Entry = m_Dict->FindULAnyVersion((*i).UL.Value());
      fprintf(stream, "  %s %s\n", (*i).EncodeString(identbuf, IdentBufferLen), (Entry ? Entry->name : "Unknown"));
    }
}